

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O1

bool __thiscall
cmAddCustomTargetCommand::InitialPass
          (cmAddCustomTargetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *input;
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool command_expand_lists;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ostream *poVar9;
  pointer pbVar10;
  cmTarget *this_00;
  ulong uVar11;
  ulong uVar12;
  string *__x;
  bool uses_terminal;
  undefined4 uVar13;
  bool bVar14;
  bool local_2e8;
  cmCustomCommandLine currentLine;
  char *local_2b8;
  string working_directory;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string job_pool;
  string comment_buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  string local_50;
  
  input = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (input == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    _e = (pointer)local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&e,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != local_1b8) {
      operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                  local_1b8[0]._M_local_buf[0]) + 1);
    }
    return false;
  }
  lVar8 = std::__cxx11::string::find_first_of((char *)input,0x4f1a7d,0);
  if (lVar8 != -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&e,"called with invalid target name \"",0x21);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,(input->_M_dataplus)._M_p,input->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\".  Target names may not contain a slash.  ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Use ADD_CUSTOM_COMMAND to generate files.",0x29);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&working_directory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)working_directory._M_dataplus._M_p != &working_directory.field_2) {
      operator_delete(working_directory._M_dataplus._M_p,
                      CONCAT71(working_directory.field_2._M_allocated_capacity._1_7_,
                               working_directory.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_158);
    return false;
  }
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  working_directory._M_dataplus._M_p = (pointer)&working_directory.field_2;
  working_directory._M_string_length = 0;
  working_directory.field_2._M_local_buf[0] = '\0';
  comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
  comment_buffer._M_string_length = 0;
  comment_buffer.field_2._M_local_buf[0] = '\0';
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  job_pool._M_dataplus._M_p = (pointer)&job_pool.field_2;
  job_pool._M_string_length = 0;
  job_pool.field_2._M_local_buf[0] = '\0';
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 1;
  local_2e8 = true;
  bVar14 = true;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10)) {
    iVar6 = std::__cxx11::string::compare((char *)(pbVar10 + 1));
    bVar14 = iVar6 != 0;
    uVar7 = 2 - bVar14;
  }
  uVar12 = (ulong)uVar7;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
  uVar13 = 0;
  bVar5 = uVar12 < uVar11;
  if (uVar12 < uVar11) {
    local_2b8 = (char *)0x0;
    command_expand_lists = false;
    uses_terminal = false;
    bVar3 = 0;
    do {
      uVar7 = uVar7 + 1;
      __x = pbVar10 + uVar12;
      iVar6 = std::__cxx11::string::compare((char *)__x);
      bVar4 = true;
      if (iVar6 == 0) {
LAB_0017c3bf:
        bVar4 = true;
        uVar13 = 1;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__x);
        if (iVar6 == 0) {
LAB_0017c2d0:
          bVar4 = true;
          uVar13 = 2;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)__x);
          if (iVar6 == 0) {
            uVar13 = 3;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)__x);
            if (iVar6 == 0) {
              bVar3 = 1;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)__x);
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)__x);
                bVar4 = true;
                if (iVar6 == 0) {
                  command_expand_lists = true;
                  uVar13 = 7;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)__x);
                  if (iVar6 == 0) {
LAB_0017c207:
                    uVar13 = 4;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)__x);
                    if (iVar6 == 0) {
                      uVar13 = 6;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)__x);
                      if (iVar6 == 0) {
                        uVar13 = 0;
                        if (currentLine.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            currentLine.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                          push_back(&commandLines.
                                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                    ,&currentLine);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::_M_erase_at_end(&currentLine.
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ,currentLine.
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)__x);
                        if (iVar6 == 0) {
                          uVar13 = 5;
                        }
                        else {
                          switch(uVar13) {
                          case 0:
                            uVar13 = 0;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&currentLine.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ,__x);
                            break;
                          case 1:
                            _e = (pointer)local_1b8;
                            pcVar1 = (__x->_M_dataplus)._M_p;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&e,pcVar1,pcVar1 + __x->_M_string_length);
                            cmsys::SystemTools::ConvertToUnixSlashes((string *)&e);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<std::__cxx11::string>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&depends,(string *)&e);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)_e != local_1b8) {
                              operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                                          local_1b8[0]._M_local_buf[0]) + 1);
                            }
                            goto LAB_0017c3bf;
                          case 2:
                            _e = (pointer)local_1b8;
                            local_1b8[0]._M_local_buf[0] = '\0';
                            bVar4 = cmsys::SystemTools::FileIsFullPath(__x);
                            if (!bVar4) {
                              cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                                        ((this->super_cmCommand).Makefile);
                              std::__cxx11::string::_M_assign((string *)&e);
                              std::__cxx11::string::append((char *)&e);
                            }
                            std::__cxx11::string::_M_append
                                      ((char *)&e,(ulong)(__x->_M_dataplus)._M_p);
                            cmsys::SystemTools::ConvertToUnixSlashes((string *)&e);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&byproducts,(value_type *)&e);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)_e != local_1b8) {
                              operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                                          local_1b8[0]._M_local_buf[0]) + 1);
                            }
                            goto LAB_0017c2d0;
                          case 3:
                            std::__cxx11::string::_M_assign((string *)&working_directory);
                            uVar13 = 3;
                            break;
                          case 4:
                            std::__cxx11::string::_M_assign((string *)&comment_buffer);
                            local_2b8 = comment_buffer._M_dataplus._M_p;
                            goto LAB_0017c207;
                          case 5:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&sources,__x);
                            uVar13 = 5;
                            break;
                          case 6:
                            std::__cxx11::string::_M_assign((string *)&job_pool);
                            uVar13 = 6;
                            break;
                          default:
                            _e = (pointer)local_1b8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&e,"Wrong syntax. Unknown type of argument.","");
                            cmCommand::SetError(&this->super_cmCommand,(string *)&e);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)_e != local_1b8) {
                              operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                                          local_1b8[0]._M_local_buf[0]) + 1);
                            }
                            bVar4 = false;
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0017c3c5;
              }
              uses_terminal = true;
            }
            uVar13 = 7;
            bVar4 = true;
          }
        }
      }
LAB_0017c3c5:
      if (!bVar4) break;
      uVar12 = (ulong)uVar7;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
      bVar5 = uVar12 < uVar11;
    } while (uVar12 < uVar11);
    local_2e8 = (bool)(bVar3 ^ 1);
  }
  else {
    uses_terminal = false;
    command_expand_lists = false;
    local_2b8 = (char *)0x0;
  }
  if (!bVar5) {
    lVar8 = std::__cxx11::string::find_first_of((char *)input,0x4ec415,0);
    if (lVar8 == -1) {
      bVar5 = cmGeneratorExpression::IsValidTargetName(input);
      if (bVar5) {
        bVar5 = cmGlobalGenerator::IsReservedTarget(input);
        bVar5 = !bVar5;
      }
      else {
        bVar5 = false;
      }
      if (bVar5) {
        lVar8 = std::__cxx11::string::find((char)input,0x3a);
        bVar5 = lVar8 == -1;
      }
      if ((bVar5) ||
         (bVar5 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,input,UTILITY), bVar5))
      {
        if (currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     &currentLine);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(&currentLine.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ,currentLine.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        local_1b8[0]._M_local_buf[0] = '\0';
        _e = (pointer)local_1b8;
        bVar5 = cmMakefile::EnforceUniqueName
                          ((this->super_cmCommand).Makefile,input,(string *)&e,true);
        if (bVar5) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != local_1b8) {
            operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                        local_1b8[0]._M_local_buf[0]) + 1);
          }
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,(string *)&e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != local_1b8) {
            operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                        local_1b8[0]._M_local_buf[0]) + 1);
          }
          if (!bVar5) goto LAB_0017c546;
        }
        if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
            super__Vector_impl_data._M_start ==
            commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_finish) goto LAB_0017c70f;
            if (uses_terminal == false) {
              if (!(bool)(commandLines.
                          super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                          ._M_impl.super__Vector_impl_data._M_start ==
                          commandLines.
                          super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                          ._M_impl.super__Vector_impl_data._M_finish & command_expand_lists))
              goto LAB_0017c70f;
              pcVar2 = (this->super_cmCommand).Makefile;
              _e = (pointer)local_1b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&e,
                         "COMMAND_EXPAND_LISTS may not be specified without any COMMAND","");
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
            }
            else {
              pcVar2 = (this->super_cmCommand).Makefile;
              _e = (pointer)local_1b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&e,"USES_TERMINAL may not be specified without any COMMAND","");
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
            }
          }
          else {
            pcVar2 = (this->super_cmCommand).Makefile;
            _e = (pointer)local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&e,"BYPRODUCTS may not be specified without any COMMAND","");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != local_1b8) {
            operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                        local_1b8[0]._M_local_buf[0]) + 1);
          }
          bVar14 = true;
          goto LAB_0017c548;
        }
LAB_0017c70f:
        if (!(bool)(job_pool._M_string_length != 0 & uses_terminal)) {
          this_00 = cmMakefile::AddUtilityCommand
                              ((this->super_cmCommand).Makefile,input,Project,bVar14,
                               working_directory._M_dataplus._M_p,&byproducts,&depends,&commandLines
                               ,local_2e8,local_2b8,uses_terminal,command_expand_lists,&job_pool);
          bVar14 = true;
          cmTarget::AddSources(this_00,&sources);
          goto LAB_0017c548;
        }
        _e = (pointer)local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&e,"JOB_POOL is shadowed by USES_TERMINAL.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_1b8) {
          operator_delete(_e,CONCAT71(local_1b8[0]._M_allocated_capacity._1_7_,
                                      local_1b8[0]._M_local_buf[0]) + 1);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&e,"called with target name containing a \"",0x26);
      local_50._M_dataplus._M_p._0_1_ = (input->_M_dataplus)._M_p[lVar8];
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,(char *)&local_50,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"\".  This character is not allowed.",0x22);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::ios_base::~ios_base(local_158);
    }
  }
LAB_0017c546:
  bVar14 = false;
LAB_0017c548:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)job_pool._M_dataplus._M_p != &job_pool.field_2) {
    operator_delete(job_pool._M_dataplus._M_p,
                    CONCAT71(job_pool.field_2._M_allocated_capacity._1_7_,
                             job_pool.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_buffer._M_dataplus._M_p != &comment_buffer.field_2) {
    operator_delete(comment_buffer._M_dataplus._M_p,
                    CONCAT71(comment_buffer.field_2._M_allocated_capacity._1_7_,
                             comment_buffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working_directory._M_dataplus._M_p != &working_directory.field_2) {
    operator_delete(working_directory._M_dataplus._M_p,
                    CONCAT71(working_directory.field_2._M_allocated_capacity._1_7_,
                             working_directory.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return bVar14;
}

Assistant:

bool cmAddCustomTargetCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    std::ostringstream e;
    e << "called with invalid target name \"" << targetName
      << "\".  Target names may not contain a slash.  "
      << "Use ADD_CUSTOM_COMMAND to generate files.";
    this->SetError(e.str());
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends, byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy)) {
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    std::ostringstream msg;
    msg << "called with target name containing a \"" << targetName[pos]
        << "\".  This character is not allowed.";
    this->SetError(msg.str());
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk &&
      !this->Makefile->CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(targetName, msg, true)) {
      this->SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    this->SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  bool escapeOldStyle = !verbatim;
  cmTarget* target = this->Makefile->AddUtilityCommand(
    targetName, cmMakefile::TargetOrigin::Project, excludeFromAll,
    working_directory.c_str(), byproducts, depends, commandLines,
    escapeOldStyle, comment, uses_terminal, command_expand_lists, job_pool);

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}